

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

void luaO_tostring(lua_State *L,StkId obj)

{
  TValue *pTVar1;
  int iVar2;
  size_t sVar3;
  lconv *plVar4;
  TString *pTVar5;
  TString *x_;
  TValue *io;
  size_t len;
  char buff [50];
  StkId obj_local;
  lua_State *L_local;
  
  if (obj->tt_ == 0x13) {
    iVar2 = snprintf((char *)&len,0x32,"%lld",(obj->value_).gc);
    io = (TValue *)(long)iVar2;
  }
  else {
    iVar2 = snprintf((char *)&len,0x32,"%.14g",(obj->value_).gc);
    io = (TValue *)(long)iVar2;
    sVar3 = strspn((char *)&len,"-0123456789");
    if (buff[sVar3 - 8] == '\0') {
      plVar4 = localeconv();
      pTVar1 = io + -6;
      *(char *)((long)&len + (long)io) = *plVar4->decimal_point;
      io = (TValue *)((long)&io->value_ + 2);
      ((undefined1 *)((long)&pTVar1->tt_ + 1))[(long)register0x00000020] = 0x30;
    }
  }
  pTVar5 = luaS_newlstr(L,(char *)&len,(size_t)io);
  (obj->value_).gc = (GCObject *)pTVar5;
  obj->tt_ = pTVar5->tt | 0x40;
  return;
}

Assistant:

void luaO_tostring(lua_State *L, StkId obj) {
    char buff[MAXNUMBER2STR];
    size_t len;
    lua_assert(ttisnumber(obj));
    if (ttisinteger(obj))
        len = lua_integer2str(buff, sizeof(buff), ivalue(obj));
    else {
        len = lua_number2str(buff, sizeof(buff), fltvalue(obj));
#if !defined(LUA_COMPAT_FLOATSTRING)
        if (buff[strspn(buff, "-0123456789")] == '\0') {  /* looks like an int? */
            buff[len++] = lua_getlocaledecpoint();
            buff[len++] = '0';  /* adds '.0' to result */
        }
#endif
    }
    setsvalue2s(L, obj, luaS_newlstr(L, buff, len));
}